

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceBuffer::prepareResources
          (MemoryQualifierInstanceBuffer *this,VkDeviceSize bufferSizeInBytes)

{
  VkBuffer buffer;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> data;
  RefData<vk::Handle<(vk::HandleType)12>_> data_00;
  VkFormat format;
  VkDevice device_00;
  DeviceInterface *vk;
  Buffer *pBVar1;
  VkBuffer *pVVar2;
  Buffer *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  Move<vk::Handle<(vk::HandleType)12>_> local_e0;
  RefData<vk::Handle<(vk::HandleType)12>_> local_c0;
  DefaultDeleter<vkt::image::Buffer> local_9d [17];
  deUint32 local_8c;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> local_88;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *local_78;
  undefined1 local_68 [8];
  VkBufferCreateInfo bufferCreateInfo;
  Allocator *allocator;
  DeviceInterface *deviceInterface;
  VkDevice device;
  VkDeviceSize bufferSizeInBytes_local;
  MemoryQualifierInstanceBuffer *this_local;
  
  device_00 = Context::getDevice((this->super_MemoryQualifierInstanceBase).super_TestInstance.
                                 m_context);
  vk = Context::getDeviceInterface
                 ((this->super_MemoryQualifierInstanceBase).super_TestInstance.m_context);
  bufferCreateInfo.pQueueFamilyIndices =
       (deUint32 *)
       Context::getDefaultAllocator
                 ((this->super_MemoryQualifierInstanceBase).super_TestInstance.m_context);
  makeBufferCreateInfo((VkBufferCreateInfo *)local_68,bufferSizeInBytes,8);
  pBVar1 = (Buffer *)operator_new(0x30);
  local_8c = ::vk::MemoryRequirement::HostVisible.m_flags;
  image::Buffer::Buffer
            (pBVar1,vk,device_00,(Allocator *)bufferCreateInfo.pQueueFamilyIndices,
             (VkBufferCreateInfo *)local_68,::vk::MemoryRequirement::HostVisible);
  de::DefaultDeleter<vkt::image::Buffer>::DefaultDeleter(local_9d);
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::MovePtr();
  local_78 = de::details::MovePtr::operator_cast_to_PtrData(&local_88,(MovePtr *)pBVar1);
  data._8_8_ = in_stack_fffffffffffffec0;
  data.ptr = in_stack_fffffffffffffeb8;
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::operator=
            (&(this->super_MemoryQualifierInstanceBase).m_buffer,data);
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::~MovePtr
            ((MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_88);
  pBVar1 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
           operator->(&(this->super_MemoryQualifierInstanceBase).m_buffer.
                       super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                     );
  pVVar2 = image::Buffer::get(pBVar1);
  buffer.m_internal = pVVar2->m_internal;
  format = ::vk::mapTextureFormat(&(this->super_MemoryQualifierInstanceBase).m_format);
  makeBufferView(&local_e0,vk,device_00,buffer,format,0,bufferSizeInBytes);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_c0,(Move *)&local_e0);
  data_00.deleter.m_deviceIface = local_c0.deleter.m_deviceIface;
  data_00.object.m_internal = local_c0.object.m_internal;
  data_00.deleter.m_device = local_c0.deleter.m_device;
  data_00.deleter.m_allocator = local_c0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::operator=(&this->m_bufferView,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::~Move(&local_e0);
  return;
}

Assistant:

void MemoryQualifierInstanceBuffer::prepareResources (const VkDeviceSize bufferSizeInBytes)
{
	const VkDevice			device			= m_context.getDevice();
	const DeviceInterface&	deviceInterface = m_context.getDeviceInterface();
	Allocator&				allocator		= m_context.getDefaultAllocator();

	// Create a buffer to store shader output
	const VkBufferCreateInfo bufferCreateInfo = makeBufferCreateInfo(bufferSizeInBytes, VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT);
	m_buffer = de::MovePtr<Buffer>(new Buffer(deviceInterface, device, allocator, bufferCreateInfo, MemoryRequirement::HostVisible));

	m_bufferView = makeBufferView(deviceInterface, device, m_buffer->get(), mapTextureFormat(m_format), 0ull, bufferSizeInBytes);
}